

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O2

links_entry_conflict * find_entry(archive_entry_linkresolver *res,archive_entry *entry)

{
  uint *puVar1;
  links_entry_conflict *plVar2;
  links_entry_conflict *plVar3;
  dev_t dVar4;
  ulong uVar5;
  dev_t dVar6;
  ulong uVar7;
  ulong uVar8;
  links_entry_conflict *plVar9;
  
  if (res->spare != (links_entry_conflict *)0x0) {
    archive_entry_free(res->spare->canonical);
    archive_entry_free(res->spare->entry);
    free(res->spare);
    res->spare = (links_entry_conflict *)0x0;
  }
  dVar4 = archive_entry_dev(entry);
  uVar5 = archive_entry_ino64(entry);
  uVar8 = res->number_buckets - 1 & (uVar5 ^ dVar4);
  plVar9 = (links_entry_conflict *)(res->buckets + uVar8);
  do {
    plVar9 = plVar9->next;
    if (plVar9 == (links_entry_conflict *)0x0) {
      return (links_entry_conflict *)0x0;
    }
  } while (((plVar9->hash != (uVar5 ^ dVar4)) ||
           (dVar6 = archive_entry_dev(plVar9->canonical), dVar4 != dVar6)) ||
          (uVar7 = archive_entry_ino64(plVar9->canonical), uVar5 != uVar7));
  puVar1 = &plVar9->links;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    plVar2 = plVar9->next;
    plVar3 = plVar9->previous;
    if (plVar3 != (links_entry_conflict *)0x0) {
      plVar3->next = plVar2;
    }
    if (plVar2 != (links_entry_conflict *)0x0) {
      plVar2->previous = plVar3;
    }
    if (res->buckets[uVar8] == plVar9) {
      res->buckets[uVar8] = plVar2;
    }
    res->number_entries = res->number_entries - 1;
    res->spare = plVar9;
  }
  return plVar9;
}

Assistant:

static struct links_entry *
find_entry(struct archive_entry_linkresolver *res,
    struct archive_entry *entry)
{
	struct links_entry	*le;
	size_t			 hash, bucket;
	dev_t			 dev;
	int64_t			 ino;

	/* Free a held entry. */
	if (res->spare != NULL) {
		archive_entry_free(res->spare->canonical);
		archive_entry_free(res->spare->entry);
		free(res->spare);
		res->spare = NULL;
	}

	dev = archive_entry_dev(entry);
	ino = archive_entry_ino64(entry);
	hash = (size_t)(dev ^ ino);

	/* Try to locate this entry in the links cache. */
	bucket = hash & (res->number_buckets - 1);
	for (le = res->buckets[bucket]; le != NULL; le = le->next) {
		if (le->hash == hash
		    && dev == archive_entry_dev(le->canonical)
		    && ino == archive_entry_ino64(le->canonical)) {
			/*
			 * Decrement link count each time and release
			 * the entry if it hits zero.  This saves
			 * memory and is necessary for detecting
			 * missed links.
			 */
			--le->links;
			if (le->links > 0)
				return (le);
			/* Remove it from this hash bucket. */
			if (le->previous != NULL)
				le->previous->next = le->next;
			if (le->next != NULL)
				le->next->previous = le->previous;
			if (res->buckets[bucket] == le)
				res->buckets[bucket] = le->next;
			res->number_entries--;
			/* Defer freeing this entry. */
			res->spare = le;
			return (le);
		}
	}
	return (NULL);
}